

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall Liby::EventLoop::EventLoop(EventLoop *this,string *chooser)

{
  bool bVar1;
  unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> local_58;
  pointer local_50;
  unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_> local_48;
  unique_ptr<Liby::PollerEpoll,_std::default_delete<Liby::PollerEpoll>_> local_40;
  unique_ptr<Liby::PollerSelect,_std::default_delete<Liby::PollerSelect>_> local_38;
  unique_ptr<Liby::PollerPoll,_std::default_delete<Liby::PollerPoll>_> local_30 [3];
  string *local_18;
  string *chooser_local;
  EventLoop *this_local;
  
  local_18 = chooser;
  chooser_local = (string *)this;
  std::unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>>::
  unique_ptr<std::default_delete<Liby::Poller>,void>
            ((unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>> *)this);
  std::unique_ptr<Liby::EventQueue,std::default_delete<Liby::EventQueue>>::
  unique_ptr<std::default_delete<Liby::EventQueue>,void>
            ((unique_ptr<Liby::EventQueue,std::default_delete<Liby::EventQueue>> *)&this->equeue_);
  std::unique_ptr<Liby::TimerQueue,std::default_delete<Liby::TimerQueue>>::
  unique_ptr<std::default_delete<Liby::TimerQueue>,void>
            ((unique_ptr<Liby::TimerQueue,std::default_delete<Liby::TimerQueue>> *)&this->tqueue_);
  std::function<Liby::EventLoop_*(int)>::function(&this->rf_);
  std::function<Liby::EventLoop_*(int)>::function(&this->rf1_);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            (&this->nextLoopHandlers_);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            (&this->afterLoopHandlers_);
  bVar1 = std::operator==(local_18,"POLL");
  if (bVar1) {
    std::make_unique<Liby::PollerPoll>();
    std::unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>>::operator=
              ((unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>> *)this,local_30);
    std::unique_ptr<Liby::PollerPoll,_std::default_delete<Liby::PollerPoll>_>::~unique_ptr(local_30)
    ;
  }
  else {
    bVar1 = std::operator==(local_18,"SELECT");
    if (bVar1) {
      std::make_unique<Liby::PollerSelect>();
      std::unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>>::operator=
                ((unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>> *)this,&local_38);
      std::unique_ptr<Liby::PollerSelect,_std::default_delete<Liby::PollerSelect>_>::~unique_ptr
                (&local_38);
    }
    else {
      std::make_unique<Liby::PollerEpoll>();
      std::unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>>::operator=
                ((unique_ptr<Liby::Poller,std::default_delete<Liby::Poller>> *)this,&local_40);
      std::unique_ptr<Liby::PollerEpoll,_std::default_delete<Liby::PollerEpoll>_>::~unique_ptr
                (&local_40);
    }
  }
  local_50 = std::unique_ptr<Liby::Poller,_std::default_delete<Liby::Poller>_>::get(&this->poller_);
  std::make_unique<Liby::EventQueue,Liby::Poller*>((Poller **)&local_48);
  std::unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::operator=
            (&this->equeue_,&local_48);
  std::unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::~unique_ptr(&local_48);
  std::unique_ptr<Liby::Poller,_std::default_delete<Liby::Poller>_>::get(&this->poller_);
  std::make_unique<Liby::TimerQueue,Liby::Poller*>((Poller **)&local_58);
  std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::operator=
            (&this->tqueue_,&local_58);
  std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::~unique_ptr(&local_58);
  return;
}

Assistant:

EventLoop::EventLoop(const std::string &chooser) {
    if (chooser == "POLL") {
        poller_ = std::make_unique<PollerPoll>();
    } else if (chooser == "SELECT") {
        poller_ = std::make_unique<PollerSelect>();
    } else {
#ifdef __linux__
        poller_ = std::make_unique<PollerEpoll>();
#elif defined(__APPLE__)
        poller_ = std::make_unique<PollerKevent>();
#endif
    }

    equeue_ = std::make_unique<EventQueue>(poller_.get());
    tqueue_ = std::make_unique<TimerQueue>(poller_.get());
}